

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O3

bool __thiscall V4L2Device::set_format(V4L2Device *this)

{
  int iVar1;
  Writer *pWVar2;
  int *piVar3;
  char *__s;
  size_t sVar4;
  bool bVar5;
  undefined1 *puVar6;
  v4l2_format format;
  undefined1 local_160 [64];
  Logger *local_120;
  char *local_118;
  DispatchAction local_110;
  IOBuffer local_108;
  pointer local_f8;
  undefined4 local_f0 [2];
  void *local_e8;
  undefined4 local_e0;
  
  bVar5 = false;
  memset(local_f0,0,0xd0);
  local_f0[0] = 1;
  local_e0 = 0x47504a4d;
  parse_resolution((V4L2Device *)local_160);
  local_e8 = (void *)CONCAT44((int)local_160._0_8_,SUB84(local_160._0_8_,4));
  if (local_160[8] == Global) {
    iVar1 = ioctl(this->fd,0xc0d05605,local_f0);
    bVar5 = true;
    if (iVar1 < 0) {
      local_160._0_8_ = &PTR__Writer_00162088;
      local_160._8_2_ = Error;
      local_160._16_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
      ;
      local_160._24_8_ = (void *)0x153;
      local_160._32_8_ = "bool V4L2Device::set_format()";
      local_160._40_2_ = 0;
      local_160._48_8_ = (Logger *)0x0;
      local_160[0x38] = false;
      local_120 = (Logger *)0x0;
      local_118 = "";
      local_110 = NormalLog;
      local_108.start = (void *)0x0;
      local_108.size = 0;
      local_f8 = (pointer)0x0;
      pWVar2 = el::base::Writer::construct((Writer *)local_160,1,"default");
      if (pWVar2->m_proceed == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar2->m_messageBuilder).m_logger)->field_0x50,
                   "VIDIOC_S_FMT failed: ",0x15);
        if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&((pWVar2->m_messageBuilder).m_logger)->field_0x50," ",1);
        }
      }
      piVar3 = __errno_location();
      __s = strerror(*piVar3);
      if (pWVar2->m_proceed == true) {
        puVar6 = &((pWVar2->m_messageBuilder).m_logger)->field_0x50;
        if (__s == (char *)0x0) {
          std::ios::clear((int)puVar6 + (int)*(undefined8 *)(*(long *)puVar6 + -0x18));
        }
        else {
          sVar4 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar6,__s,sVar4);
        }
        if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&((pWVar2->m_messageBuilder).m_logger)->field_0x50," ",1);
        }
      }
      el::base::Writer::~Writer((Writer *)local_160);
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool
    set_format()
    {
        struct v4l2_format format;
        std::memset(&format, 0, sizeof(format));

        format.type = V4L2_BUF_TYPE_VIDEO_CAPTURE;
        format.fmt.pix.pixelformat = V4L2_PIX_FMT_MJPEG;
        bool ok;

        std::tie(ok, format.fmt.pix.width, format.fmt.pix.height) = parse_resolution();

        if (not ok) {
            return false;
        }

        if (ioctl(fd, VIDIOC_S_FMT, &format) < 0) {
            LOG(ERROR) << "VIDIOC_S_FMT failed: " << strerror(errno);
            return false;
        }

        return true;
    }